

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O0

MPP_RET dpb_remove_unused_frame(Avs2dCtx_t *p_dec)

{
  Avs2dFrame_t *p_00;
  RK_S32 RVar1;
  int local_2c;
  Avs2dFrameMgr_t *mgr;
  Avs2dFrame_t *p;
  MPP_RET ret;
  RK_U32 i;
  Avs2dCtx_t *p_dec_local;
  
  p._0_4_ = MPP_OK;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_unused_frame");
  }
  p._4_4_ = 0;
  do {
    if ((p_dec->frm_mgr).dpb_size <= p._4_4_) {
LAB_001b15aa:
      if ((avs2d_parse_debug & 8) != 0) {
        _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_unused_frame");
      }
      return (MPP_RET)p;
    }
    p_00 = (p_dec->frm_mgr).dpb[p._4_4_];
    if (p_00->slot_idx != -1) {
      if (p_00->poi - (p_dec->ph).poi < 0) {
        local_2c = -(p_00->poi - (p_dec->ph).poi);
      }
      else {
        local_2c = p_00->poi - (p_dec->ph).poi;
      }
      if (0x7f < local_2c) {
        p_00->refered_by_others = '\0';
        p_00->refered_by_scene = '\0';
      }
      if ((((p_00->is_output != '\0') || (p_00->invisible != '\0')) &&
          (RVar1 = is_refered(p_00), RVar1 == 0)) &&
         (p._0_4_ = dpb_remove_frame(p_dec,p_00), (MPP_RET)p < MPP_OK)) {
        if ((avs2d_parse_debug & 4) != 0) {
          _mpp_log_l(4,"avs2d_dpb","Function error(%d).\n",(char *)0x0,0x1ab);
        }
        goto LAB_001b15aa;
      }
    }
    p._4_4_ = p._4_4_ + 1;
  } while( true );
}

Assistant:

MPP_RET dpb_remove_unused_frame(Avs2dCtx_t *p_dec)
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_OK;
    Avs2dFrame_t *p = NULL;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");
    for (i = 0; i < mgr->dpb_size; i++) {
        p = mgr->dpb[i];
        if (p->slot_idx == NO_VAL) {
            continue;
        }

        if ((MPP_ABS(p->poi - p_dec->ph.poi) >= AVS2_MAX_POC_DISTANCE)) {
            p->refered_by_others = 0;
            p->refered_by_scene = 0;
        }

        if ((p->is_output || p->invisible) && !is_refered(p)) {
            FUN_CHECK(ret = dpb_remove_frame(p_dec, p));
        }
    }

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}